

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_fe(secp256k1_fe *x)

{
  int iVar1;
  uchar bin [32];
  secp256k1_fe *in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  
  do {
    testrand256(in_stack_ffffffffffffffe0);
    iVar1 = secp256k1_fe_set_b32_limit(in_stack_ffffffffffffffd8,(uchar *)0x13ff4e);
  } while (iVar1 == 0);
  return;
}

Assistant:

static void testutil_random_fe(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}